

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

atomic<google::protobuf::internal::SerialArena_*> * __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::arena
          (SerialArenaChunk *this,uint32_t i)

{
  if (((ulong)this & 7) == 0) {
    if (i < *(uint *)(this + 8)) {
      return (atomic<google::protobuf::internal::SerialArena_*> *)
             (this + (ulong)i * 8 + (ulong)*(uint *)(this + 8) * 8 + 0x10);
    }
    arena();
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long>, OffsetSeq = std::integer_sequence<unsigned long, 0>, N = 0UL, Char = const char]"
               );
}

Assistant:

std::atomic<SerialArena*>& arena(uint32_t i) {
    ABSL_DCHECK_LT(i, capacity());
    return Layout().Pointer<kArenas>(ptr())[i];
  }